

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O1

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::knn_search
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *queries,Matrix<unsigned_int> *indices
          ,Matrix<float> *dists,size_t_conflict knn,Search_Params *params)

{
  ostream *poVar1;
  time_t tVar2;
  uint uVar3;
  
  if (queries->cols != this->vec_len) {
    __assert_fail("queries.cols==vec_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5a,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (indices->rows < queries->rows) {
    __assert_fail("indices.rows>=queries.rows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5b,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (dists->rows < queries->rows) {
    __assert_fail("dists.rows>=queries.rows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5c,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (knn <= indices->cols) {
    if (knn <= dists->cols) {
      if ((ulong)this->k < params->E) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)"
                   ,0x53);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WARNINGS: The procedure will use k(",0x23);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," as the search expand.",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k."
                   ,0x56);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      uVar3 = 0;
      tVar2 = time((time_t *)0x0);
      srand((uint)tVar2);
      if (queries->rows != 0) {
        do {
          find_neighbors(this,queries->data + queries->cols * uVar3,
                         indices->data + indices->cols * uVar3,dists->data + dists->cols * uVar3,knn
                         ,params);
          uVar3 = uVar3 + 1;
        } while (uVar3 < queries->rows);
      }
      return;
    }
    __assert_fail("dists.cols>=knn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5e,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  __assert_fail("indices.cols>=knn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                ,0x5d,
                "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
               );
}

Assistant:

void knn_search(const Matrix<ElementType>& queries,
            Matrix<IndexType>& indices,
            Matrix<DistanceType> dists,
            size_t knn,
            const Search_Params& params)
        {
            //assert the vector in same dim
            assert(queries.cols==vec_len);
            assert(indices.rows>=queries.rows);
            assert(dists.rows>=queries.rows);
            assert(indices.cols>=knn);
            assert(dists.cols>=knn);

            if(params.E > k)
            {
                std::cout << "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)" << std::endl;
                std::cout << "WARNINGS: The procedure will use k(" << k << ")" << " as the search expand." << std::endl;
                std::cout << "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k." << std::endl;
            }
            srand((unsigned)time(0));
            //for each query
            for(int i=0;i<queries.rows;++i)
            {
                // std::cout << i << std::endl;
                find_neighbors(queries[i], indices[i], dists[i], knn, params);
            }
        }